

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

Operand * __thiscall IrSim::newTmpVar(IrSim *this)

{
  Operand *in_RSI;
  Operand *in_RDI;
  Operand *__lhs;
  string local_50 [28];
  int in_stack_ffffffffffffffcc;
  string local_30 [48];
  
  *(int *)&in_RSI[2].field_0x10 = *(int *)&in_RSI[2].field_0x10 + 1;
  __lhs = in_RDI;
  std::__cxx11::to_string(in_stack_ffffffffffffffcc);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  Operand::Operand(in_RSI,(int)((ulong)__lhs >> 0x20),(string *)in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  return __lhs;
}

Assistant:

Operand newTmpVar() { return Operand(OP_VARIABLE, tmpVarPrefix + to_string(tmpSeq++)); }